

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O0

double ising::counting::free_energy<lattice::graph>
                 (double beta,graph *lat,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  invalid_argument *piVar1;
  size_t sVar2;
  size_type sVar3;
  exp_number<double> *peVar4;
  size_t sVar5;
  graph *pgVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  self_ *in_XMM0_Qa;
  double dVar7;
  int c0;
  uint s;
  int cj;
  int ci;
  uint b;
  exp_double weight;
  unsigned_long c;
  exp_double sum;
  unsigned_long num_states;
  self_ *in_stack_ffffffffffffff08;
  graph *in_stack_ffffffffffffff10;
  exp_number<double> *in_stack_ffffffffffffff38;
  exp_number<double> *in_stack_ffffffffffffff40;
  uint local_84;
  uint local_64;
  ulong local_50;
  
  if ((double)in_XMM0_Qa <= 0.0) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"beta should be positive");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar2 = lattice::graph::num_sites((graph *)0x13be41);
  if (sVar2 < 0x1f) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    sVar2 = lattice::graph::num_bonds((graph *)0x13bec4);
    if (sVar3 != sVar2) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"inconsitent table size of interaction");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar3 != 0) {
      in_stack_ffffffffffffff40 =
           (exp_number<double> *)std::vector<double,_std::allocator<double>_>::size(in_RDX);
      peVar4 = (exp_number<double> *)lattice::graph::num_sites((graph *)0x13bf65);
      if (in_stack_ffffffffffffff40 != peVar4) {
        piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar1,"inconsitent table size of external field");
        __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    sVar2 = lattice::graph::num_sites((graph *)0x13bfdd);
    standards::exp_number<double>::exp_number
              ((exp_number<double> *)in_stack_ffffffffffffff10,
               (value_type_conflict2)in_stack_ffffffffffffff08);
    for (local_50 = 0; local_50 < (ulong)(long)(1 << ((byte)sVar2 & 0x1f)); local_50 = local_50 + 1)
    {
      standards::exp_number<double>::exp_number
                ((exp_number<double> *)in_stack_ffffffffffffff10,
                 (value_type_conflict2)in_stack_ffffffffffffff08);
      for (local_64 = 0; sVar5 = lattice::graph::num_bonds((graph *)0x13c05b), local_64 < sVar5;
          local_64 = local_64 + 1) {
        lattice::graph::source(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
        lattice::graph::target(in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)local_64);
        standards::exp_number<double>::exp_number
                  ((exp_number<double> *)in_stack_ffffffffffffff10,
                   (value_type_conflict2)in_stack_ffffffffffffff08);
        standards::exp_number<double>::operator*=
                  ((exp_number<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar3 != 0) {
        local_84 = 0;
        while( true ) {
          in_stack_ffffffffffffff10 = (graph *)(ulong)local_84;
          pgVar6 = (graph *)lattice::graph::num_sites((graph *)0x13c193);
          if (pgVar6 <= in_stack_ffffffffffffff10) break;
          in_stack_ffffffffffffff08 = in_XMM0_Qa;
          std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(ulong)local_84);
          standards::exp_number<double>::exp_number
                    ((exp_number<double> *)in_stack_ffffffffffffff10,
                     (value_type_conflict2)in_stack_ffffffffffffff08);
          standards::exp_number<double>::operator*=
                    ((exp_number<double> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          local_84 = local_84 + 1;
        }
      }
      standards::exp_number<double>::operator+=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
      ;
    }
    dVar7 = standards::log<double>((exp_number<double> *)0x13c263);
    return -dVar7 / (double)in_XMM0_Qa;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"too large lattice");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    if (lat.num_sites() > 30)
      throw(std::invalid_argument("too large lattice"));
    if (inter.size() != lat.num_bonds())
      throw(std::invalid_argument("inconsitent table size of interaction"));
    if (field.size() > 0 && field.size() != lat.num_sites())
      throw(std::invalid_argument("inconsitent table size of external field"));
    unsigned long num_states = 1 << lat.num_sites();
    standards::exp_double sum = 0;
    for (unsigned long c = 0; c < num_states; ++c) {
      standards::exp_double weight = 1;
      for (unsigned int b = 0; b < lat.num_bonds(); ++b) {
        int ci = (c >> lat.source(b)) & 1;
        int cj = (c >> lat.target(b)) & 1;
        weight *= standards::exp_number<double>(beta * inter[b] * (1 - 2 * (ci ^ cj)));
      }
      if (field.size()) {
        for (unsigned int s = 0; s < lat.num_sites(); ++s) {
          int c0 = (c >> s) & 1;
          weight *= standards::exp_number<double>(beta * field[s] * (1 - 2 * c0));
        }
      }
      sum += weight;
    }
    return -log(sum) / beta;
  }